

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bm_utils.c
# Opt level: O2

int pick_str(distribution *s,int c,char *target)

{
  set_member *psVar1;
  long in_RAX;
  set_member *psVar2;
  int iVar3;
  long j;
  
  j = in_RAX;
  dss_random(&j,1,s->list[(long)s->count + -1].weight,(long)c);
  iVar3 = -1;
  psVar1 = s->list;
  do {
    psVar2 = psVar1;
    iVar3 = iVar3 + 1;
    psVar1 = psVar2 + 1;
  } while (psVar2->weight < j);
  strcpy(target,psVar2->text);
  return iVar3;
}

Assistant:

int
pick_str(distribution *s, int c, char *target)
{
    long      i = 0;
    long      j;

    RANDOM(j, 1, s->list[s->count - 1].weight, c);
    while (s->list[i].weight < j)
        i++;
    strcpy(target, s->list[i].text);
    return(i);
}